

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_accessors.c
# Opt level: O2

void aec_get_rsi_8(aec_stream *strm)

{
  uint32_t *puVar1;
  uchar *puVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  puVar1 = strm->state->data_raw;
  puVar2 = strm->next_in;
  uVar3 = strm->block_size * strm->rsi;
  uVar4 = 0;
  uVar5 = 0;
  if (0 < (int)uVar3) {
    uVar5 = (ulong)uVar3;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    puVar1[uVar4] = (uint)puVar2[uVar4];
  }
  strm->next_in = puVar2 + (int)uVar3;
  strm->avail_in = strm->avail_in - (long)(int)uVar3;
  return;
}

Assistant:

void aec_get_rsi_8(struct aec_stream *strm)
{
    uint32_t *restrict out = strm->state->data_raw;
    unsigned const char *restrict in = strm->next_in;
    int rsi = strm->rsi * strm->block_size;

    for (int i = 0; i < rsi; i++)
        out[i] = (uint32_t)in[i];

    strm->next_in += rsi;
    strm->avail_in -= rsi;
}